

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall PowerPos<0,_0,_0>::propagate_case_zero(PowerPos<0,_0,_0> *this)

{
  IntVar *pIVar1;
  int iVar2;
  long lVar3;
  
  pIVar1 = (this->x).var;
  if (((pIVar1->max).v == 0) && (0 < (((this->z).var)->max).v)) {
    if (so.lazy) {
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[9])();
      lVar3 = (long)iVar2 * 4 + 2;
    }
    else {
      lVar3 = 0;
    }
    pIVar1 = (this->z).var;
    iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,0,lVar3,1);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  pIVar1 = (this->z).var;
  if (((pIVar1->max).v == 0) && (0 < (((this->x).var)->max).v)) {
    if (so.lazy == true) {
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[9])();
      lVar3 = (long)iVar2 * 4 + 2;
    }
    else {
      lVar3 = 0;
    }
    pIVar1 = (this->x).var;
    iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,0,lVar3,1);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate_case_zero() {
		// x -> z
		if (x.getMax() == 0) {
			setDom(z, setMax, 0, x.getMaxLit());
		}
		// z -> x
		if (z.getMax() == 0) {
			setDom(x, setMax, 0, z.getMaxLit());
		}
		return true;
	}